

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O0

rational<unsigned_char> * __thiscall
tcb::rational<unsigned_char>::operator/=
          (rational<unsigned_char> *this,rational<unsigned_char> *other)

{
  value_type_conflict2 vVar1;
  rational<unsigned_char> *other_local;
  rational<unsigned_char> *this_local;
  
  vVar1 = denom(other);
  this->num_ = this->num_ * vVar1;
  vVar1 = num(other);
  this->denom_ = this->denom_ * vVar1;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator/=(const rational<U>& other)
    {
        num_ *= other.denom();
        denom_ *= other.num();
        simplify();
        return *this;
    }